

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR1.cpp
# Opt level: O0

bool isVt(string *str)

{
  __type _Var1;
  int local_20;
  int i;
  int len;
  string *str_local;
  
  local_20 = 0;
  while( true ) {
    if (0x1f < local_20) {
      return false;
    }
    _Var1 = std::operator==(str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(strVt_abi_cxx11_ + (long)local_20 * 0x20));
    if (_Var1) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool isVt(string &str) {
//    int len = strVt->length();//这样算出来的长度永远为1！！！！
    int len = sizeof(strVt) / sizeof(strVt[0]);
    for (int i = 0; i < len; i++) {
        if (str == strVt[i]) {
            return true;
        }
    }
    return false;
}